

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

void color_quantize3(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  JDIMENSION JVar2;
  jpeg_color_quantizer *pjVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  JDIMENSION width;
  JDIMENSION col;
  int row;
  JSAMPROW colorindex2;
  JSAMPROW colorindex1;
  JSAMPROW colorindex0;
  JSAMPROW ptrout;
  JSAMPROW ptrin;
  int pixcode;
  my_cquantize_ptr cquantize;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JSAMPARRAY input_buf_local;
  j_decompress_ptr cinfo_local;
  
  pjVar3 = cinfo->cquantize;
  lVar4 = *(long *)pjVar3[1].finish_pass;
  lVar5 = *(long *)(pjVar3[1].finish_pass + 8);
  lVar6 = *(long *)(pjVar3[1].finish_pass + 0x10);
  JVar2 = cinfo->output_width;
  for (row = 0; row < num_rows; row = row + 1) {
    ptrin = input_buf[row];
    ptrout = output_buf[row];
    for (col = JVar2; col != 0; col = col - 1) {
      pbVar7 = ptrin + 1;
      bVar1 = *ptrin;
      pbVar8 = ptrin + 2;
      ptrin = ptrin + 3;
      *ptrout = *(char *)(lVar6 + (ulong)*pbVar8) +
                *(char *)(lVar5 + (ulong)*pbVar7) + *(char *)(lVar4 + (ulong)bVar1);
      ptrout = ptrout + 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
color_quantize3(j_decompress_ptr cinfo, JSAMPARRAY input_buf,
                JSAMPARRAY output_buf, int num_rows)
/* Fast path for out_color_components==3, no dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  register int pixcode;
  register JSAMPROW ptrin, ptrout;
  JSAMPROW colorindex0 = cquantize->colorindex[0];
  JSAMPROW colorindex1 = cquantize->colorindex[1];
  JSAMPROW colorindex2 = cquantize->colorindex[2];
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;

  for (row = 0; row < num_rows; row++) {
    ptrin = input_buf[row];
    ptrout = output_buf[row];
    for (col = width; col > 0; col--) {
      pixcode  = colorindex0[*ptrin++];
      pixcode += colorindex1[*ptrin++];
      pixcode += colorindex2[*ptrin++];
      *ptrout++ = (JSAMPLE)pixcode;
    }
  }
}